

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O2

bool __thiscall spv::Builder::isValidInitializer(Builder *this,Id resultId)

{
  bool bVar1;
  
  bVar1 = isConstant(this,resultId);
  if (bVar1) {
    return true;
  }
  bVar1 = isGlobalVariable(this,resultId);
  return bVar1;
}

Assistant:

bool isValidInitializer(Id resultId) const { return isConstant(resultId) || isGlobalVariable(resultId); }